

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall
leveldb::InternalFilterPolicy::CreateFilter
          (InternalFilterPolicy *this,Slice *keys,int n,string *dst)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  Slice SVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 * 0x10 != lVar2; lVar2 = lVar2 + 0x10) {
    SVar4 = ExtractUserKey((Slice *)((long)&keys->data_ + lVar2));
    *(char **)((long)&keys->data_ + lVar2) = SVar4.data_;
    *(size_t *)((long)&keys->size_ + lVar2) = SVar4.size_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (*this->user_policy_->_vptr_FilterPolicy[3])(this->user_policy_,keys,(ulong)(uint)n,dst);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InternalFilterPolicy::CreateFilter(const Slice* keys, int n,
                                        std::string* dst) const {
  // We rely on the fact that the code in table.cc does not mind us
  // adjusting keys[].
  Slice* mkey = const_cast<Slice*>(keys);
  for (int i = 0; i < n; i++) {
    mkey[i] = ExtractUserKey(keys[i]);
    // TODO(sanjay): Suppress dups?
  }
  user_policy_->CreateFilter(keys, n, dst);
}